

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O3

void fmt::v8::detail::format_value<char,my_type>(buffer<char> *buf,my_type *value,locale_ref loc)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  formatbuf<char> format_buf;
  basic_ostream<char,_std::char_traits<char>_> output;
  locale_ref lStack_198;
  locale local_190 [8];
  void *local_188;
  undefined **local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  locale local_148 [8];
  buffer<char> *local_140;
  long local_138;
  ios_base local_130 [20];
  undefined4 auStack_11c [61];
  
  local_180 = (undefined **)mktime;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_188 = loc.locale_;
  std::locale::locale(local_148);
  local_180 = &PTR__streambuf_00159920;
  local_140 = buf;
  std::ostream::ostream((ostream *)&local_138,(streambuf *)&local_180);
  if (loc.locale_ != (void *)0x0) {
    locale_ref::get<std::locale>(&lStack_198);
    std::ios::imbue(local_190);
    std::locale::~locale(local_190);
    std::locale::~locale((locale *)&lStack_198);
  }
  operator<<((basic_ostream<char,_std::char_traits<char>_> *)&local_138,value);
  lVar1 = *(long *)(local_138 + -0x18);
  *(undefined4 *)((long)auStack_11c + lVar1) = 5;
  std::ios::clear((int)&lStack_198 + (int)lVar1 + 0x60);
  uVar3 = buf->size_;
  uVar2 = buf->capacity_;
  if (uVar2 < uVar3) {
    (**buf->_vptr_buffer)(buf,uVar3);
    uVar2 = buf->capacity_;
  }
  if (uVar2 < uVar3) {
    uVar3 = uVar2;
  }
  buf->size_ = uVar3;
  std::ios_base::~ios_base(local_130);
  local_180 = (undefined **)mktime;
  std::locale::~locale(local_148);
  return;
}

Assistant:

void format_value(buffer<Char>& buf, const T& value,
                  locale_ref loc = locale_ref()) {
  formatbuf<Char> format_buf(buf);
  std::basic_ostream<Char> output(&format_buf);
#if !defined(FMT_STATIC_THOUSANDS_SEPARATOR)
  if (loc) output.imbue(loc.get<std::locale>());
#endif
  output << value;
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  buf.try_resize(buf.size());
}